

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

bool __thiscall cmProjectCommand::IncludeByVariable(cmProjectCommand *this,string *variable)

{
  cmMakefile *this_00;
  bool bVar1;
  char *__s;
  bool bVar2;
  allocator<char> local_41;
  string m;
  
  __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,variable);
  bVar2 = true;
  if (__s != (char *)0x0) {
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&m,__s,&local_41);
    bVar1 = cmMakefile::ReadDependentFile(this_00,&m,true);
    std::__cxx11::string::~string((string *)&m);
    if (!bVar1) {
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m,"could not find file:\n  ",&local_41);
        std::__cxx11::string::append((char *)&m);
        cmCommand::SetError(&this->super_cmCommand,&m);
        std::__cxx11::string::~string((string *)&m);
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmProjectCommand::IncludeByVariable(const std::string& variable)
{
  const char* include = this->Makefile->GetDefinition(variable);
  if (!include) {
    return true;
  }

  const bool readit = this->Makefile->ReadDependentFile(include);
  if (readit) {
    return true;
  }

  if (cmSystemTools::GetFatalErrorOccured()) {
    return true;
  }

  std::string m = "could not find file:\n"
                  "  ";
  m += include;
  this->SetError(m);
  return false;
}